

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TtfUtil.cpp
# Opt level: O1

bool TtfUtil::CalcAbsolutePoints(int *prgnX,int *prgnY,size_t cnPoints)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  
  if (1 < cnPoints) {
    iVar1 = *prgnY;
    iVar2 = *prgnX;
    sVar3 = 1;
    do {
      iVar2 = iVar2 + prgnX[sVar3];
      prgnX[sVar3] = iVar2;
      iVar1 = iVar1 + prgnY[sVar3];
      prgnY[sVar3] = iVar1;
      sVar3 = sVar3 + 1;
    } while (cnPoints != sVar3);
  }
  return true;
}

Assistant:

bool CalcAbsolutePoints(int * prgnX, int * prgnY, size_t cnPoints)
{
	int nX = prgnX[0];
	int nY = prgnY[0];
	for (size_t i = 1; i < cnPoints; ++i)
	{
		prgnX[i] += nX;
		nX = prgnX[i];
		prgnY[i] += nY;
		nY = prgnY[i];
	}

	return true;
}